

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

int resampler_run_blep_sse(resampler *r,float **out_,float *out_end)

{
  float fVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  undefined8 *puVar10;
  float *pfVar11;
  ulong in_RDX;
  long *in_RSI;
  int *in_RDI;
  float fVar12;
  float kernel_sum;
  double sample;
  int window_step;
  int step;
  bigint inv_phase_inc;
  bigint inv_phase;
  double last_amp;
  float *in_end;
  float *in;
  float *out;
  int used;
  float *in_;
  int in_size;
  int local_1cc;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188 [2];
  undefined8 auStack_180 [16];
  float local_fc;
  ulong local_e0;
  double local_d8;
  float *local_c8;
  long local_c0;
  int local_b4;
  int window_pos;
  int pos;
  int i;
  int phase_adj;
  int phase_reduced;
  float *kernelf;
  __m128 samplex;
  __m128 temp2;
  __m128 temp1;
  float fStack_30;
  float fStack_2c;
  
  iVar2 = in_RDI[1];
  pfVar9 = (float *)(in_RDI + (long)*in_RDI + (0x52 - (long)in_RDI[1]));
  local_b4 = 0;
  if (0 < iVar2 + -1) {
    local_c0 = *in_RSI;
    local_d8 = *(double *)(in_RDI + 0xe);
    local_e0 = *(ulong *)(in_RDI + 8);
    lVar3 = *(long *)(in_RDI + 10);
    local_c8 = pfVar9;
    do {
      if (in_RDX < local_c0 + 0x80U) break;
      pfVar11 = local_c8 + 1;
      dVar4 = (double)*local_c8 - local_d8;
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        local_fc = 0.0;
        iVar7 = (int)(local_e0 >> 0x16);
        for (local_1cc = 0x10; -0x10 < local_1cc; local_1cc = local_1cc + -1) {
          iVar8 = (iVar7 * 0x399) / 0x400 + local_1cc * -0x399;
          if (iVar8 < 1) {
            iVar8 = -iVar8;
          }
          fVar12 = sinc_lut[iVar8];
          iVar8 = iVar7 + local_1cc * -0x400;
          if (iVar8 < 1) {
            iVar8 = -iVar8;
          }
          fVar1 = window_lut[iVar8];
          *(float *)((long)auStack_180 + (long)(local_1cc + 0xf) * 4 + -8) = fVar12 * fVar1;
          local_fc = fVar12 * fVar1 + local_fc;
        }
        local_d8 = local_d8 + dVar4;
        fVar12 = (float)(dVar4 / (double)local_fc);
        for (local_1cc = 0; local_1cc < 8; local_1cc = local_1cc + 1) {
          samplex[2] = (float)auStack_180[(long)local_1cc * 2 + -1];
          samplex[3] = (float)((ulong)auStack_180[(long)local_1cc * 2 + -1] >> 0x20);
          temp2[0] = (float)auStack_180[(long)local_1cc * 2];
          temp2[1] = (float)((ulong)auStack_180[(long)local_1cc * 2] >> 0x20);
          puVar10 = (undefined8 *)(local_c0 + (long)(local_1cc << 2) * 4);
          uVar5 = *puVar10;
          uVar6 = puVar10[1];
          temp1[2] = (float)uVar5;
          temp1[3] = (float)((ulong)uVar5 >> 0x20);
          fStack_30 = (float)uVar6;
          fStack_2c = (float)((ulong)uVar6 >> 0x20);
          local_198 = CONCAT44(samplex[3] * fVar12 + temp1[3],samplex[2] * fVar12 + temp1[2]);
          uStack_190 = CONCAT44(temp2[1] * fVar12 + fStack_2c,temp2[0] * fVar12 + fStack_30);
          puVar10 = (undefined8 *)(local_c0 + (long)(local_1cc << 2) * 4);
          *puVar10 = local_198;
          puVar10[1] = uStack_190;
        }
      }
      local_c0 = (lVar3 + local_e0 >> 0x20) * 4 + local_c0;
      local_e0 = lVar3 + local_e0 & 0xffffffff;
      local_c8 = pfVar11;
    } while (pfVar11 < pfVar9 + (iVar2 + -1));
    *(ulong *)(in_RDI + 8) = local_e0;
    *(double *)(in_RDI + 0xe) = local_d8;
    *in_RSI = local_c0;
    local_b4 = (int)((long)local_c8 - (long)pfVar9 >> 2);
    in_RDI[1] = in_RDI[1] - local_b4;
  }
  return local_b4;
}

Assistant:

static int resampler_run_blep_sse(resampler * r, float ** out_, float * out_end)
{
    int in_size = r->write_filled;
    float const* in_ = r->buffer_in + resampler_buffer_size + r->write_pos - r->write_filled;
    int used = 0;
    in_size -= 1;
    if ( in_size > 0 )
    {
        float* out = *out_;
        float const* in = in_;
        float const* const in_end = in + in_size;
        double last_amp = r->last_amp;
        bigint inv_phase = r->inv_phase;
        bigint inv_phase_inc = r->inv_phase_inc;

        const int step = (int)(RESAMPLER_BLEP_CUTOFF * RESAMPLER_RESOLUTION);
        const int window_step = RESAMPLER_RESOLUTION;
        
        do
        {
            double sample;
            
            if ( out + SINC_WIDTH * 2 > out_end )
                break;
            
            sample = *in++ - last_amp;
            
            if (sample)
            {
                float kernel_sum = 0.0f;
                __m128 kernel[SINC_WIDTH / 2];
                __m128 temp1, temp2;
                __m128 samplex;
                float *kernelf = (float*)(&kernel);
                int phase_reduced = PHASE_REDUCE(inv_phase);
                int phase_adj = phase_reduced * step / RESAMPLER_RESOLUTION;
                int i = SINC_WIDTH;

                for (; i >= -SINC_WIDTH + 1; --i)
                {
                    int pos = i * step;
                    int window_pos = i * window_step;
                    kernel_sum += kernelf[i + SINC_WIDTH - 1] = sinc_lut[abs(phase_adj - pos)] * window_lut[abs(phase_reduced - window_pos)];
                }
                last_amp += sample;
                sample /= kernel_sum;
				samplex = _mm_set1_ps( (float)sample );
                for (i = 0; i < SINC_WIDTH / 2; ++i)
                {
                    temp1 = _mm_load_ps( (const float *)( kernel + i ) );
                    temp1 = _mm_mul_ps( temp1, samplex );
                    temp2 = _mm_loadu_ps( (const float *) out + i * 4 );
                    temp1 = _mm_add_ps( temp1, temp2 );
                    _mm_storeu_ps( (float *) out + i * 4, temp1 );
                }
            }
            
            inv_phase.quad += inv_phase_inc.quad;
            
            ADD_HI(out, inv_phase);
            
            CLEAR_HI(inv_phase);
        }
        while ( in < in_end );
        
        r->inv_phase = inv_phase;
        r->last_amp = last_amp;
        *out_ = out;
        
        used = (int)(in - in_);
        
        r->write_filled -= used;
    }
    
    return used;
}